

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiKeyRoutingTable::Clear(ImGuiKeyRoutingTable *this)

{
  int n;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x8c; lVar1 = lVar1 + 1) {
    this->Index[lVar1] = -1;
  }
  ImVector<ImGuiKeyRoutingData>::clear(&this->Entries);
  ImVector<ImGuiKeyRoutingData>::clear(&this->EntriesNext);
  return;
}

Assistant:

void Clear()                    { for (int n = 0; n < IM_ARRAYSIZE(Index); n++) Index[n] = -1; Entries.clear(); EntriesNext.clear(); }